

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::GetItem
               (RecyclableObject *instance,uint64 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  if (index < 0xffffffff) {
    BVar1 = GetItem(instance,instance,(uint32)index,value,requestContext);
    return BVar1;
  }
  local_38 = (PropertyRecord *)0x0;
  GetPropertyIdForInt(index,requestContext,&local_38);
  BVar1 = GetProperty_Internal<false>
                    (instance,instance,false,local_38->pid,value,requestContext,
                     (PropertyValueInfo *)0x0);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::GetItem(RecyclableObject* instance, uint64 index, Var* value, ScriptContext* requestContext)
    {
        if (index < JavascriptArray::InvalidIndex)
        {
            // In case index fits in uint32, we can avoid the (slower) big-index path
            return GetItem(instance, static_cast<uint32>(index), value, requestContext);
        }
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, requestContext, &propertyRecord);
        return JavascriptOperators::GetProperty(instance, propertyRecord->GetPropertyId(), value, requestContext);
    }